

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_build_obmc_inter_prediction
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **above,int *above_stride,uint8_t **left,
               int *left_stride)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  MB_MODE_INFO **ppMVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint8_t *puVar13;
  _func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
  **pp_Var14;
  MB_MODE_INFO *pMVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  int plane;
  uint uVar22;
  uint uVar20;
  long lVar21;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  uint length;
  int plane_1;
  int *piVar26;
  int iVar27;
  uint local_b8;
  
  ppMVar6 = xd->mi;
  uVar10 = (ulong)(*ppMVar6)->bsize;
  if (xd->up_available == true) {
    uVar2 = xd->mi_col;
    lVar11 = (long)(int)uVar2;
    iVar18 = xd->width + uVar2;
    iVar3 = (cm->mi_params).mi_cols;
    if (iVar3 <= iVar18) {
      iVar18 = iVar3;
    }
    if (((0x3efffcUL >> (uVar10 & 0x3f) & 1) != 0) && ((int)uVar2 < iVar18)) {
      iVar3 = max_neighbor_obmc[""[uVar10]];
      lVar12 = (long)xd->mi_stride;
      uVar1 = cm->seq_params->monochrome;
      iVar25 = 0;
      uVar20 = uVar2;
      do {
        bVar16 = 0x10;
        if ((0x1f07ffUL >> ((ulong)ppMVar6[((int)uVar20 - lVar12) - lVar11]->bsize & 0x3f) & 1) != 0
           ) {
          bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [ppMVar6[((int)uVar20 - lVar12) - lVar11]->bsize];
        }
        lVar21 = ((int)uVar20 - lVar12) - lVar11;
        uVar22 = uVar20 & 0xfffffffe;
        if (bVar16 == 1) {
          bVar16 = 2;
          uVar20 = uVar22;
          lVar21 = (((long)(int)uVar22 + 1) - lVar12) - lVar11;
        }
        if (((ppMVar6[lVar21]->field_0xa7 & 0x80) != 0) || ('\0' < ppMVar6[lVar21]->ref_frame[0])) {
          uVar22._0_1_ = xd->width;
          uVar22._1_1_ = xd->height;
          uVar22._2_2_ = *(undefined2 *)&xd->field_0x2076;
          if (bVar16 <= (byte)(undefined1)uVar22) {
            uVar22 = (uint)bVar16;
          }
          uVar23 = (ulong)(*xd->mi)->bsize;
          uVar24 = 0x20;
          if ((0x2f0bffUL >> (uVar23 & 0x3f) & 1) != 0) {
            uVar24 = (uint)(block_size_high[uVar23] >> 1);
          }
          iVar25 = iVar25 + 1;
          lVar21 = 0;
          piVar26 = &xd->plane[0].subsampling_x;
          do {
            bVar17 = (byte)*piVar26;
            length = uVar24 >> ((byte)piVar26[1] & 0x1f);
            if (BLOCK_8X4 < av1_ss_size_lookup[uVar23][*piVar26][piVar26[1]]) {
              iVar19 = (int)((uVar20 - uVar2) * 4) >> (bVar17 & 0x1f);
              uVar4 = piVar26[9];
              puVar7 = ((buf_2d *)(piVar26 + 3))->buf;
              uVar5 = above_stride[lVar21];
              puVar8 = above[lVar21];
              iVar27 = 0x9af80d;
              puVar13 = av1_get_obmc_mask(length);
              if ((xd->cur_buf->flags & 8) == 0) {
                pp_Var14 = &aom_blend_a64_vmask;
              }
              else {
                iVar27 = xd->bd;
                pp_Var14 = (_func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
                            **)&aom_highbd_blend_a64_vmask;
              }
              (**pp_Var14)(puVar7 + iVar19,uVar4,puVar7 + iVar19,uVar4,puVar8 + iVar19,uVar5,puVar13
                           ,((uVar22 & 0xff) << 2) >> (bVar17 & 0x1f),length,iVar27);
            }
            lVar21 = lVar21 + 1;
            piVar26 = piVar26 + 0x28c;
          } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar21);
        }
        uVar20 = uVar20 + bVar16;
      } while (((int)uVar20 < iVar18) && (iVar25 < iVar3));
    }
  }
  if (xd->left_available == true) {
    uVar2 = xd->mi_row;
    iVar18 = xd->height + uVar2;
    iVar3 = (cm->mi_params).mi_rows;
    if (iVar3 <= iVar18) {
      iVar18 = iVar3;
    }
    if (((0x3dfffaUL >> (uVar10 & 0x3f) & 1) != 0) && ((int)uVar2 < iVar18)) {
      iVar3 = max_neighbor_obmc[""[uVar10]];
      ppMVar6 = xd->mi;
      lVar11 = (long)xd->mi_stride * (long)(int)uVar2;
      uVar1 = cm->seq_params->monochrome;
      iVar25 = 0;
      uVar20 = uVar2;
      do {
        pMVar15 = ppMVar6[((long)(int)(xd->mi_stride * uVar20) + -1) - lVar11];
        uVar10 = (ulong)pMVar15->bsize;
        bVar16 = 0x10;
        uVar22 = uVar20;
        if ((0x2f0bffUL >> (uVar10 & 0x3f) & 1) != 0) {
          if ((0x20005UL >> (uVar10 & 0x3f) & 1) == 0) {
            bVar16 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [uVar10];
          }
          else {
            uVar22 = uVar20 & 0xfffffffe;
            pMVar15 = ppMVar6[((long)(int)(xd->mi_stride * (uVar20 | 1)) + -1) - lVar11];
            bVar16 = 2;
          }
        }
        if (((pMVar15->field_0xa7 & 0x80) != 0) || ('\0' < pMVar15->ref_frame[0])) {
          bVar17 = xd->height;
          if (bVar16 <= xd->height) {
            bVar17 = bVar16;
          }
          uVar10 = (ulong)(*xd->mi)->bsize;
          local_b8 = 0x20;
          if ((0x1f07ffUL >> (uVar10 & 0x3f) & 1) != 0) {
            local_b8 = (uint)(block_size_wide[uVar10] >> 1);
          }
          iVar25 = iVar25 + 1;
          lVar12 = 0;
          piVar26 = &xd->plane[0].subsampling_x;
          do {
            uVar20 = local_b8 >> ((byte)*piVar26 & 0x1f);
            iVar19 = piVar26[1];
            iVar9 = (int)((uVar22 - uVar2) * 4) >> ((byte)iVar19 & 0x1f);
            uVar4 = piVar26[9];
            puVar7 = ((buf_2d *)(piVar26 + 3))->buf;
            uVar5 = left_stride[lVar12];
            puVar8 = left[lVar12];
            iVar27 = 0x9afae7;
            puVar13 = av1_get_obmc_mask(uVar20);
            if ((xd->cur_buf->flags & 8) == 0) {
              pp_Var14 = &aom_blend_a64_hmask;
            }
            else {
              iVar27 = xd->bd;
              pp_Var14 = (_func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
                          **)&aom_highbd_blend_a64_hmask;
            }
            (**pp_Var14)(puVar7 + (int)(iVar9 * uVar4),uVar4,puVar7 + (int)(iVar9 * uVar4),uVar4,
                         puVar8 + (int)(iVar9 * uVar5),uVar5,puVar13,uVar20,
                         ((uint)bVar17 << 2) >> ((byte)iVar19 & 0x1f),iVar27);
            lVar12 = lVar12 + 1;
            piVar26 = piVar26 + 0x28c;
          } while ((ulong)(uVar1 == '\0') * 2 + 1 != lVar12);
        }
        uVar20 = uVar22 + bVar16;
      } while (((int)uVar20 < iVar18) && (iVar25 < iVar3));
    }
  }
  return;
}

Assistant:

void av1_build_obmc_inter_prediction(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                     uint8_t *above[MAX_MB_PLANE],
                                     int above_stride[MAX_MB_PLANE],
                                     uint8_t *left[MAX_MB_PLANE],
                                     int left_stride[MAX_MB_PLANE]) {
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  // handle above row
  struct obmc_inter_pred_ctxt ctxt_above = { above, above_stride };
  foreach_overlappable_nb_above(cm, xd,
                                max_neighbor_obmc[mi_size_wide_log2[bsize]],
                                build_obmc_inter_pred_above, &ctxt_above);

  // handle left column
  struct obmc_inter_pred_ctxt ctxt_left = { left, left_stride };
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_inter_pred_left, &ctxt_left);
}